

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O1

void testwin7(wins *wins_ar,int ar_len)

{
  long *plVar1;
  ulong uVar2;
  long lVar3;
  Am_Style local_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  
  uVar2 = (ulong)(uint)ar_len;
  puts("Entering testwin7:");
  printf("  Hit RETURN to change background color of D2:");
  getchar();
  if (0 < ar_len) {
    lVar3 = 0;
    do {
      plVar1 = *(long **)((long)&wins_ar->d2 + lVar3);
      Am_Style::Am_Style(local_38,(Am_Style *)&yellow);
      (**(code **)(*plVar1 + 0x80))(plVar1,local_38);
      Am_Style::~Am_Style(local_38);
      lVar3 = lVar3 + 0x40;
    } while (uVar2 << 6 != lVar3);
  }
  printf("  Hit RETURN to revert background color of D2:");
  getchar();
  if (0 < ar_len) {
    lVar3 = 0;
    do {
      plVar1 = *(long **)((long)&wins_ar->d2 + lVar3);
      Am_Style::Am_Style(local_40,(Am_Style *)&green);
      (**(code **)(*plVar1 + 0x80))(plVar1,local_40);
      Am_Style::~Am_Style(local_40);
      lVar3 = lVar3 + 0x40;
    } while (uVar2 << 6 != lVar3);
  }
  printf("  Hit RETURN to change background color of D1:");
  getchar();
  if (0 < ar_len) {
    lVar3 = 0;
    do {
      plVar1 = *(long **)((long)&wins_ar->d1 + lVar3);
      Am_Style::Am_Style(local_48,(Am_Style *)&purple);
      (**(code **)(*plVar1 + 0x80))(plVar1,local_48);
      Am_Style::~Am_Style(local_48);
      lVar3 = lVar3 + 0x40;
    } while (uVar2 << 6 != lVar3);
  }
  return;
}

Assistant:

void
testwin7(wins *wins_ar, int ar_len)
{

  printf("Entering testwin7:\n");
  printf("  Hit RETURN to change background color of D2:");
  getchar();
  int i;
  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d2)->Set_Background_Color(yellow);
  }

  printf("  Hit RETURN to revert background color of D2:");
  getchar();
  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d2)->Set_Background_Color(green);
  }

  printf("  Hit RETURN to change background color of D1:");
  getchar();
  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d1)->Set_Background_Color(purple);
  }
}